

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commit.cpp
# Opt level: O2

void commit(int argc,char **argv)

{
  FILE *pFVar1;
  ulong uVar2;
  long lVar3;
  string dest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string destination_dir;
  string source;
  string new_hash;
  vector<FileStatus,_std::allocator<FileStatus>_> local_180;
  vector<FileStatus,_std::allocator<FileStatus>_> status;
  string local_150;
  string seed;
  string old_hash;
  string time;
  string str;
  string msg;
  GlobalConfig globalConfig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  stageStatus();
  if (status.super__Vector_base<FileStatus,_std::allocator<FileStatus>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      status.super__Vector_base<FileStatus,_std::allocator<FileStatus>_>._M_impl.
      super__Vector_impl_data._M_start) {
    puts("Nothing to commit");
    exit(0);
  }
  if (0 < argc) {
    std::__cxx11::string::string((string *)&msg,*argv,(allocator *)&globalConfig);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::vector(&local_180,&status);
    strStatus_abi_cxx11_(&str,&local_180);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector(&local_180);
    getGlobalConfig();
    getTime_abi_cxx11_();
    last_commit_hash_abi_cxx11_();
    std::operator+(&source,&msg,&str);
    std::operator+(&dest,&source,&globalConfig.name);
    std::operator+(&destination_dir,&dest,&globalConfig.email);
    std::operator+(&new_hash,&destination_dir,&time);
    std::operator+(&seed,&new_hash,&old_hash);
    std::__cxx11::string::~string((string *)&new_hash);
    std::__cxx11::string::~string((string *)&destination_dir);
    std::__cxx11::string::~string((string *)&dest);
    std::__cxx11::string::~string((string *)&source);
    std::__cxx11::string::string((string *)&local_150,(string *)&seed);
    hash(&new_hash,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::operator+(&dest,&COMMITS_DIR_abi_cxx11_,"/");
    std::operator+(&destination_dir,&dest,&new_hash);
    std::__cxx11::string::~string((string *)&dest);
    mkdir(destination_dir._M_dataplus._M_p,0x1ff);
    ls_abi_cxx11_(&files,STAGE_DIR_abi_cxx11_._M_dataplus._M_p);
    lVar3 = 0;
    for (uVar2 = 0;
        uVar2 < (ulong)((long)files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)files.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
      std::operator+(&source,&destination_dir,"/");
      std::operator+(&dest,&source,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3
                     ));
      std::__cxx11::string::~string((string *)&source);
      std::operator+(&local_50,&STAGE_DIR_abi_cxx11_,"/");
      std::operator+(&source,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3
                     ));
      std::__cxx11::string::~string((string *)&local_50);
      copy((EVP_PKEY_CTX *)source._M_dataplus._M_p,(EVP_PKEY_CTX *)dest._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&source);
      std::__cxx11::string::~string((string *)&dest);
      lVar3 = lVar3 + 0x20;
    }
    pFVar1 = fopen(HEAD_abi_cxx11_._M_dataplus._M_p,"a");
    fprintf(pFVar1,"%s\n",new_hash._M_dataplus._M_p);
    fclose(pFVar1);
    pFVar1 = fopen(LOG_abi_cxx11_._M_dataplus._M_p,"a");
    fwrite("------------\n",0xd,1,pFVar1);
    fprintf(pFVar1,"Hash: %s\n",new_hash._M_dataplus._M_p);
    fprintf(pFVar1,"Msg: %s\n",msg._M_dataplus._M_p);
    fprintf(pFVar1,"Create by name:%s email:%s\n",globalConfig.name._M_dataplus._M_p,
            globalConfig.email._M_dataplus._M_p);
    fprintf(pFVar1,"On:%s\n\n",time._M_dataplus._M_p);
    fclose(pFVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files);
    std::__cxx11::string::~string((string *)&destination_dir);
    std::__cxx11::string::~string((string *)&new_hash);
    std::__cxx11::string::~string((string *)&seed);
    std::__cxx11::string::~string((string *)&old_hash);
    std::__cxx11::string::~string((string *)&time);
    GlobalConfig::~GlobalConfig(&globalConfig);
    std::__cxx11::string::~string((string *)&str);
    std::__cxx11::string::~string((string *)&msg);
    std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector(&status);
    return;
  }
  puts("Need commit msg");
  exit(1);
}

Assistant:

void commit(int argc, char *argv[]){
    Vector<FileStatus> status = stageStatus();
    if(status.size()==0){
        printf("Nothing to commit\n");
        exit(EXIT_SUCCESS);
    }
    if(argc <1){
        printf("Need commit msg\n");
        exit(EXIT_FAILURE);
    }
    String msg = argv[0];
    String str = strStatus(status);
    GlobalConfig globalConfig = getGlobalConfig();
    String time = getTime();
    String old_hash = last_commit_hash();
    String seed = msg + str + globalConfig.name + globalConfig.email + time + old_hash;
    String new_hash = hash(seed);
    String destination_dir = COMMITS_DIR + "/" + new_hash;

    mkdir(destination_dir.c_str(),DEFAULT_PERM);
    Vector<String> files = ls(STAGE_DIR.c_str());
    for(int i = 0; i < files.size();i++){
        String dest = destination_dir + "/" + files[i];
        String source = STAGE_DIR + "/" + files[i];
        copy(source.c_str(),dest.c_str());
    }
    FILE * file = fopen(HEAD.c_str(),"a");
    fprintf(file,"%s\n",new_hash.c_str());
    fclose(file);
    file = fopen(LOG.c_str(),"a");

    fprintf(file,"------------\n");
    fprintf(file,"Hash: %s\n",new_hash.c_str());
    fprintf(file,"Msg: %s\n",msg.c_str());
    fprintf(file,"Create by name:%s email:%s\n",globalConfig.name.c_str(),globalConfig.email.c_str());
    fprintf(file,"On:%s\n\n",time.c_str());
    fclose(file);
}